

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * __thiscall ODDLParser::OpenDDLParser::parseStructure(OpenDDLParser *this,char *in,char *end)

{
  pointer ppDVar1;
  char *in_00;
  bool error;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  
  if (in != end && in != (char *)0x0) {
    local_4a = false;
    in_00 = lookForNextToken<char>(in,end);
    if (*in_00 == '{') {
      do {
        in_00 = parseStructureBody(this,in_00,end,&local_4a);
        if (in_00 == (char *)0x0) {
          return (char *)0x0;
        }
      } while (*in_00 != '}');
      in = lookForNextToken<char>(in_00 + 1,end);
      if ((local_4a == false) &&
         (ppDVar1 = (this->m_stack).
                    super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
         (this->m_stack).
         super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
         super__Vector_impl_data._M_start != ppDVar1)) {
        (this->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppDVar1 + -1;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"{",&local_49);
      logInvalidTokenError(in_00 + 1,&local_48,this->m_logCallback);
      std::__cxx11::string::~string((string *)&local_48);
      in = (char *)0x0;
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseStructure( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    bool error( false );
    in = lookForNextToken( in, end );
    if( *in == *Grammar::OpenBracketToken) {
        // loop over all children ( data and nodes )
        do {
            in = parseStructureBody( in, end, error );
            if(in == ddl_nullptr){
                return ddl_nullptr;
            }
        } while ( *in != *Grammar::CloseBracketToken);
        ++in;
    } else {
        ++in;
        logInvalidTokenError( in, std::string( Grammar::OpenBracketToken ), m_logCallback );
        return ddl_nullptr;
    }
    in = lookForNextToken( in, end );

    // pop node from stack after successful parsing
    if( !error ) {
        popNode();
    }

    return in;
}